

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O1

void __thiscall tt::net::HttpData::handleError(HttpData *this,int fd,int err_num,string *short_msg)

{
  size_type *psVar1;
  bool bVar2;
  _Alloc_hider __val;
  uint uVar3;
  char cVar4;
  long *plVar5;
  size_t sVar6;
  uint uVar7;
  long *plVar8;
  size_type *psVar9;
  _Alloc_hider _Var10;
  ulong uVar11;
  uint uVar12;
  char cVar13;
  uint __uval;
  uint __val_00;
  undefined1 local_1108 [8];
  char send_buff [4096];
  size_type *local_100;
  string __str;
  string __str_1;
  string body_buff;
  string header_buff;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1108," "
                 ,short_msg);
  header_buff.field_2._8_8_ = short_msg;
  std::__cxx11::string::operator=((string *)short_msg,(string *)local_1108);
  if (local_1108 != (undefined1  [8])(send_buff + 8)) {
    operator_delete((void *)local_1108);
  }
  __str_1.field_2._8_8_ = &body_buff._M_string_length;
  body_buff._M_dataplus._M_p = (pointer)0x0;
  body_buff._M_string_length._0_1_ = 0;
  body_buff.field_2._8_8_ = &header_buff._M_string_length;
  header_buff._M_dataplus._M_p = (pointer)0x0;
  header_buff._M_string_length._0_1_ = 0;
  std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
  std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
  __val_00 = -err_num;
  if (0 < err_num) {
    __val_00 = err_num;
  }
  uVar12 = 1;
  if (9 < __val_00) {
    uVar11 = (ulong)__val_00;
    uVar3 = 4;
    do {
      uVar12 = uVar3;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_001088f3;
      }
      if (uVar7 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_001088f3;
      }
      if (uVar7 < 10000) goto LAB_001088f3;
      uVar11 = uVar11 / 10000;
      uVar3 = uVar12 + 4;
    } while (99999 < uVar7);
    uVar12 = uVar12 + 1;
  }
LAB_001088f3:
  cVar13 = (char)(err_num >> 0x1f);
  local_70 = &local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar12 - cVar13);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_70 + (ulong)((uint)err_num >> 0x1f)),uVar12,__val_00);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,*(ulong *)header_buff.field_2._8_8_);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append(__str_1.field_2._M_local_buf + 8,(ulong)local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
  uVar12 = 1;
  if (9 < __val_00) {
    uVar11 = (ulong)__val_00;
    uVar3 = 4;
    do {
      uVar12 = uVar3;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_00108a14;
      }
      if (uVar7 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_00108a14;
      }
      if (uVar7 < 10000) goto LAB_00108a14;
      uVar11 = uVar11 / 10000;
      uVar3 = uVar12 + 4;
    } while (99999 < uVar7);
    uVar12 = uVar12 + 1;
  }
LAB_00108a14:
  local_100 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar12 - cVar13);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)err_num >> 0x1f) + (long)local_100),uVar12,__val_00);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x111a9e);
  psVar1 = &__str_1._M_string_length;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    __str_1._M_string_length = *psVar9;
    __str_1.field_2._M_allocated_capacity = plVar5[3];
    __str.field_2._8_8_ = psVar1;
  }
  else {
    __str_1._M_string_length = *psVar9;
    __str.field_2._8_8_ = (size_type *)*plVar5;
  }
  __str_1._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             (__str.field_2._M_local_buf + 8,*(ulong *)header_buff.field_2._8_8_);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append(body_buff.field_2._M_local_buf + 8,(ulong)local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((size_type *)__str.field_2._8_8_ != psVar1) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if (local_100 != &__str._M_string_length) {
    operator_delete(local_100);
  }
  std::__cxx11::string::append(body_buff.field_2._M_local_buf + 8);
  std::__cxx11::string::append(body_buff.field_2._M_local_buf + 8);
  __val = body_buff._M_dataplus;
  cVar13 = '\x01';
  if ((pointer)0x9 < body_buff._M_dataplus._M_p) {
    _Var10 = body_buff._M_dataplus;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (_Var10._M_p < (pointer)0x64) {
        cVar13 = cVar13 + -2;
        goto LAB_00108c3b;
      }
      if (_Var10._M_p < (pointer)0x3e8) {
        cVar13 = cVar13 + -1;
        goto LAB_00108c3b;
      }
      if (_Var10._M_p < (pointer)0x2710) goto LAB_00108c3b;
      bVar2 = (pointer)0x1869f < _Var10._M_p;
      _Var10._M_p = (pointer)(_Var10._M_p / 10000);
      cVar4 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_00108c3b:
  __str.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct((ulong)((long)&__str.field_2 + 8),cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)__str.field_2._8_8_,(uint)__str_1._M_dataplus._M_p,(unsigned_long)__val._M_p);
  plVar5 = (long *)std::__cxx11::string::replace
                             ((ulong)((long)&__str.field_2 + 8),0,(char *)0x0,0x1119eb);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append(body_buff.field_2._M_local_buf + 8,(ulong)local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((size_type *)__str.field_2._8_8_ != psVar1) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  std::__cxx11::string::append(body_buff.field_2._M_local_buf + 8);
  std::__cxx11::string::append(body_buff.field_2._M_local_buf + 8);
  strcpy(local_1108,(char *)body_buff.field_2._8_8_);
  sVar6 = strlen(local_1108);
  writen(fd,local_1108,sVar6);
  strcpy(local_1108,(char *)__str_1.field_2._8_8_);
  sVar6 = strlen(local_1108);
  writen(fd,local_1108,sVar6);
  if ((size_type *)body_buff.field_2._8_8_ != &header_buff._M_string_length) {
    operator_delete((void *)body_buff.field_2._8_8_);
  }
  if ((size_type *)__str_1.field_2._8_8_ != &body_buff._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  return;
}

Assistant:

void HttpData::handleError(int fd, int err_num, std::string short_msg) {
  short_msg = " " + short_msg;
  char send_buff[4096];
  std::string body_buff, header_buff;
  body_buff += "<html><title>哎~出错了</title>";
  body_buff += "<body bgcolor=\"ffffff\">";
  body_buff += std::to_string(err_num) + short_msg;
  body_buff += "<hr><em> LinYa's Web Server</em>\n</body></html>";

  header_buff += "HTTP/1.1 " + std::to_string(err_num) + short_msg + "\r\n";
  header_buff += "Content-Type: text/html\r\n";
  header_buff += "Connection: Close\r\n";
  header_buff += "Content-Length: " + std::to_string(body_buff.size()) + "\r\n";
  header_buff += "Server: LinYa's Web Server\r\n";
  ;
  header_buff += "\r\n";
  // 错误处理不考虑writen不完的情况
  sprintf(send_buff, "%s", header_buff.c_str());
  writen(fd, send_buff, strlen(send_buff));
  sprintf(send_buff, "%s", body_buff.c_str());
  writen(fd, send_buff, strlen(send_buff));
}